

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_obj.c
# Opt level: O2

int lj_obj_equal(cTValue *o1,cTValue *o2)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = (o1->field_2).it;
  if (uVar1 == (o2->field_2).it) {
    bVar2 = true;
    if (0xfffffffc < uVar1) goto LAB_001096ee;
    if (0xfffefffe < uVar1) {
      bVar2 = (o1->u32).lo == (o2->u32).lo;
      goto LAB_001096ee;
    }
  }
  else if (0xfffeffff < (o2->field_2).it || 0xfffeffff < uVar1) {
    bVar2 = false;
    goto LAB_001096ee;
  }
  bVar2 = (bool)(-(o2->n == o1->n) & 1);
LAB_001096ee:
  return (int)bVar2;
}

Assistant:

int lj_obj_equal(cTValue *o1, cTValue *o2)
{
  if (itype(o1) == itype(o2)) {
    if (tvispri(o1))
      return 1;
    if (!tvisnum(o1))
      return gcrefeq(o1->gcr, o2->gcr);
  } else if (!tvisnumber(o1) || !tvisnumber(o2)) {
    return 0;
  }
  return numberVnum(o1) == numberVnum(o2);
}